

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDescriptor.cpp
# Opt level: O0

void __thiscall Liby::FileDescriptor::set_noblock(FileDescriptor *this,bool flag)

{
  int iVar1;
  uint local_24;
  int opt;
  bool flag_local;
  FileDescriptor *this_local;
  
  local_24 = fcntl(this->fd_,3);
  if ((int)local_24 < 0) {
    throw_err();
  }
  if (flag) {
    local_24 = local_24 | 0x800;
  }
  else {
    local_24 = local_24 & 0xfffff7ff;
  }
  iVar1 = fcntl(this->fd_,4,(ulong)local_24);
  if (iVar1 < 0) {
    throw_err();
  }
  return;
}

Assistant:

void Liby::FileDescriptor::set_noblock(bool flag) {
    int opt;
    opt = ::fcntl(fd_, F_GETFL);
    if (opt < 0) {
        throw_err();
    }
    opt = flag ? (opt | O_NONBLOCK) : (opt & ~O_NONBLOCK);
    if (::fcntl(fd_, F_SETFL, opt) < 0) {
        throw_err();
    }
}